

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

size_t __thiscall QPDF::tableSize(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  int iVar5;
  int *i;
  pointer pcVar6;
  int iVar7;
  allocator<char> local_59;
  double local_58;
  int local_50;
  int local_4c;
  string local_48;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  iVar5 = 0;
  iVar7 = 0;
  if (*(size_t *)((long)&(_Var1._M_head_impl)->xref_table + 0x28) != 0) {
    lVar3 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->xref_table + 8));
    iVar7 = *(int *)(lVar3 + 0x20);
  }
  pcVar6 = *(pointer *)((long)&(_Var1._M_head_impl)->obj_cache + 0x28);
  if (pcVar6 != (pointer)0x0) {
    lVar3 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->obj_cache + 8));
    iVar5 = *(int *)(lVar3 + 0x20);
  }
  if ((0x7ffffffd < iVar5) || (0x7ffffffd < iVar7)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Impossibly large object id encountered.",&local_59);
    stopOnError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pcVar6 = *(pointer *)
              ((long)&((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache + 0x28
              );
  }
  local_58 = (double)iVar5;
  local_48._M_dataplus._M_p = pcVar6;
  iVar2 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert((unsigned_long *)&local_48);
  if (iVar2 <= iVar7) {
    iVar2 = iVar7;
  }
  if ((double)iVar2 * 1.1 <= local_58) {
    local_4c = iVar7 + 1;
    i = &local_4c;
  }
  else {
    local_50 = iVar5 + 1;
    i = &local_50;
  }
  uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(i);
  return uVar4;
}

Assistant:

size_t
QPDF::tableSize()
{
    // If obj_cache is dense, accommodate all object in tables,else accommodate only original
    // objects.
    auto max_xref = m->xref_table.size() ? m->xref_table.crbegin()->first.getObj() : 0;
    auto max_obj = m->obj_cache.size() ? m->obj_cache.crbegin()->first.getObj() : 0;
    auto max_id = std::numeric_limits<int>::max() - 1;
    if (max_obj >= max_id || max_xref >= max_id) {
        // Temporary fix. Long-term solution is
        // - QPDFObjGen to enforce objgens are valid and sensible
        // - xref table and obj cache to protect against insertion of impossibly large obj ids
        stopOnError("Impossibly large object id encountered.");
    }
    if (max_obj < 1.1 * std::max(toI(m->obj_cache.size()), max_xref)) {
        return toS(++max_obj);
    }
    return toS(++max_xref);
}